

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

uint32_t __thiscall
embree::OBJLoader::getVertex
          (OBJLoader *this,
          map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
          *vertexMap,Ref<embree::SceneGraph::TriangleMeshNode> *mesh,Vertex *i)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  undefined8 uVar4;
  ulong uVar5;
  bool bVar6;
  uint32_t uVar7;
  pointer ppVar8;
  ostream *poVar9;
  unsigned_long *puVar10;
  Vec3fa *pVVar11;
  reference pvVar12;
  size_type sVar13;
  reference pvVar14;
  mapped_type *pmVar15;
  uint *in_RCX;
  undefined8 *puVar16;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *this_00;
  long *in_RDX;
  long in_RDI;
  iterator *entry;
  Vec3fa v_1;
  Vec3fa v;
  size_t i_4;
  size_t i_3;
  Vec3fa *old_items;
  size_t i_2;
  size_t i_1;
  size_t i_8;
  size_t i_7;
  Vec3fa *old_items_1;
  size_t i_6;
  size_t i_5;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
  *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  size_t in_stack_fffffffffffffbf8;
  reference in_stack_fffffffffffffc28;
  reference in_stack_fffffffffffffc30;
  undefined4 local_374;
  undefined4 local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  _Self local_358;
  _Self local_350;
  _Self *local_348;
  uint *local_340;
  uint32_t local_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 *local_308;
  reference local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_2e8;
  reference local_2e0;
  undefined8 *local_2d8;
  Vec3fa *local_2d0;
  reference local_2c8;
  reference local_2c0;
  reference local_2b8;
  reference local_2b0;
  long local_2a8;
  reference local_2a0;
  reference local_298;
  long local_290;
  long local_228;
  reference local_220;
  ulong local_218;
  long local_210;
  ulong local_208;
  long local_200;
  undefined8 *local_1f8;
  undefined4 *local_1f0;
  reference local_1e8;
  reference local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined8 *local_1c8;
  Vec3fa *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  Vec3fa *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ulong local_170;
  ulong local_168;
  Vec3fa *local_160;
  ulong local_158;
  ulong local_150;
  size_t local_148;
  ulong local_140;
  reference local_138;
  Vec3fa *local_130;
  Vec3fa *local_128;
  size_t local_120;
  reference local_118;
  size_t local_110;
  Vec3fa *local_108;
  reference local_100;
  ulong local_f8;
  ulong local_f0;
  Vec3fa *local_e8;
  ulong local_e0;
  ulong local_d8;
  size_t local_d0;
  ulong local_c8;
  reference local_c0;
  Vec3fa *local_b8;
  Vec3fa *local_b0;
  size_t local_a8;
  reference local_a0;
  size_t local_98;
  Vec3fa *local_90;
  reference local_88;
  unsigned_long local_80 [2];
  ulong local_70;
  ulong local_68;
  reference local_60;
  size_t local_58;
  unsigned_long local_50 [2];
  ulong local_40;
  ulong local_38;
  reference local_30;
  size_t local_28;
  Vec3fa *local_20;
  Vec3fa *local_18;
  Vec3fa *local_10;
  Vec3fa *local_8;
  
  local_340 = in_RCX;
  local_350._M_node =
       (_Base_ptr)
       std::
       map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
       ::find(in_stack_fffffffffffffbe8,(key_type *)0x19d234);
  local_348 = &local_350;
  local_358._M_node =
       (_Base_ptr)
       std::
       map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
       ::end(in_stack_fffffffffffffbe8);
  bVar6 = std::operator!=(&local_350,&local_358);
  if (bVar6) {
    ppVar8 = std::_Rb_tree_iterator<std::pair<const_embree::Vertex,_unsigned_int>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_embree::Vertex,_unsigned_int>_> *)
                        0x19d299);
    local_31c = ppVar8->second;
  }
  else {
    local_290 = in_RDI + 0x30;
    if ((ulong)*local_340 < *(ulong *)(in_RDI + 0x38)) {
      pvVar12 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(*in_RDX + 0x70),0);
      local_200 = in_RDI + 0x30;
      local_208 = (ulong)*local_340;
      local_2e8 = (undefined8 *)(*(long *)(in_RDI + 0x48) + local_208 * 0x10);
      local_1b0 = &local_2f8;
      local_2f8 = *local_2e8;
      uStack_2f0 = local_2e8[1];
      local_140 = pvVar12->size_active;
      local_68 = pvVar12->size_active + 1;
      local_2e0 = pvVar12;
      local_1b8 = local_2e8;
      local_60 = pvVar12;
      if (pvVar12->size_alloced < local_68) {
        local_58 = local_68;
        if (pvVar12->size_alloced != 0) {
          local_70 = pvVar12->size_alloced;
          while (local_70 < local_68) {
            local_80[1] = 1;
            local_80[0] = local_70 << 1;
            puVar10 = std::max<unsigned_long>(local_80 + 1,local_80);
            local_70 = *puVar10;
          }
          local_58 = local_70;
        }
      }
      else {
        local_58 = pvVar12->size_alloced;
      }
      local_148 = local_58;
      uVar2 = local_140;
      if (local_140 < pvVar12->size_active) {
        while (local_150 = uVar2, local_150 < pvVar12->size_active) {
          uVar2 = local_150 + 1;
        }
        pvVar12->size_active = local_140;
      }
      local_138 = pvVar12;
      if (local_58 == pvVar12->size_alloced) {
        for (local_158 = pvVar12->size_active; local_158 < local_140; local_158 = local_158 + 1) {
          local_10 = pvVar12->items + local_158;
        }
        pvVar12->size_active = local_140;
      }
      else {
        local_160 = pvVar12->items;
        local_120 = local_58;
        local_118 = pvVar12;
        pVVar11 = (Vec3fa *)
                  alignedMalloc(in_stack_fffffffffffffbf8,
                                CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
        pvVar12->items = pVVar11;
        for (local_168 = 0; local_168 < pvVar12->size_active; local_168 = local_168 + 1) {
          local_128 = pvVar12->items + local_168;
          local_130 = local_160 + local_168;
          uVar4 = *(undefined8 *)((long)&local_130->field_0 + 8);
          *(undefined8 *)&local_128->field_0 = *(undefined8 *)&local_130->field_0;
          *(undefined8 *)((long)&local_128->field_0 + 8) = uVar4;
        }
        for (local_170 = pvVar12->size_active; local_170 < local_140; local_170 = local_170 + 1) {
          local_8 = pvVar12->items + local_170;
        }
        local_110 = pvVar12->size_alloced;
        local_108 = local_160;
        local_100 = pvVar12;
        alignedFree(in_stack_fffffffffffffbe8);
        pvVar12->size_active = local_140;
        pvVar12->size_alloced = local_148;
      }
      sVar3 = pvVar12->size_active;
      pvVar12->size_active = sVar3 + 1;
      local_1c0 = pvVar12->items + sVar3;
      local_1c8 = &local_2f8;
      *(undefined8 *)&local_1c0->field_0 = local_2f8;
      *(undefined8 *)((long)&local_1c0->field_0 + 8) = uStack_2f0;
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cout,"WARNING: corrupted OBJ file");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
    }
    if (local_340[2] != 0xffffffff) {
      while( true ) {
        local_298 = std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  *)(*in_RDX + 0x88),0);
        uVar2 = local_298->size_active;
        local_2a0 = std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  *)(*in_RDX + 0x70),0);
        if (local_2a0->size_active <= uVar2) break;
        in_stack_fffffffffffffc28 =
             std::
             vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           *)(*in_RDX + 0x88),0);
        local_1f8 = &local_368;
        local_188 = 0;
        uStack_180 = 0;
        local_368 = 0;
        uStack_360 = 0;
        local_308 = &local_368;
        local_190 = &local_318;
        local_318 = 0;
        uStack_310 = 0;
        uVar2 = in_stack_fffffffffffffc28->size_active;
        local_38 = in_stack_fffffffffffffc28->size_active + 1;
        local_300 = in_stack_fffffffffffffc28;
        local_198 = local_308;
        local_30 = in_stack_fffffffffffffc28;
        if (in_stack_fffffffffffffc28->size_alloced < local_38) {
          sVar3 = local_38;
          if (in_stack_fffffffffffffc28->size_alloced != 0) {
            local_40 = in_stack_fffffffffffffc28->size_alloced;
            while (local_40 < local_38) {
              local_50[1] = 1;
              local_50[0] = local_40 << 1;
              puVar10 = std::max<unsigned_long>(local_50 + 1,local_50);
              local_40 = *puVar10;
            }
            local_28 = local_40;
            sVar3 = local_28;
          }
        }
        else {
          sVar3 = in_stack_fffffffffffffc28->size_alloced;
        }
        local_28 = sVar3;
        local_d0 = local_28;
        uVar5 = uVar2;
        if (uVar2 < in_stack_fffffffffffffc28->size_active) {
          while (local_d8 = uVar5, local_d8 < in_stack_fffffffffffffc28->size_active) {
            uVar5 = local_d8 + 1;
          }
          in_stack_fffffffffffffc28->size_active = uVar2;
        }
        in_stack_fffffffffffffc30 = in_stack_fffffffffffffc28;
        local_c8 = uVar2;
        local_c0 = in_stack_fffffffffffffc28;
        if (local_28 == in_stack_fffffffffffffc28->size_alloced) {
          for (local_e0 = in_stack_fffffffffffffc28->size_active; local_e0 < uVar2;
              local_e0 = local_e0 + 1) {
            local_20 = in_stack_fffffffffffffc28->items + local_e0;
          }
          in_stack_fffffffffffffc28->size_active = uVar2;
        }
        else {
          local_e8 = in_stack_fffffffffffffc28->items;
          local_a8 = local_28;
          local_a0 = in_stack_fffffffffffffc28;
          pVVar11 = (Vec3fa *)
                    alignedMalloc(in_stack_fffffffffffffbf8,
                                  CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
          in_stack_fffffffffffffc28->items = pVVar11;
          for (local_f0 = 0; local_f0 < in_stack_fffffffffffffc28->size_active;
              local_f0 = local_f0 + 1) {
            local_b0 = in_stack_fffffffffffffc28->items + local_f0;
            local_b8 = local_e8 + local_f0;
            uVar4 = *(undefined8 *)((long)&local_b8->field_0 + 8);
            *(undefined8 *)&local_b0->field_0 = *(undefined8 *)&local_b8->field_0;
            *(undefined8 *)((long)&local_b0->field_0 + 8) = uVar4;
          }
          for (local_f8 = in_stack_fffffffffffffc28->size_active; local_f8 < local_c8;
              local_f8 = local_f8 + 1) {
            local_18 = in_stack_fffffffffffffc28->items + local_f8;
          }
          local_98 = in_stack_fffffffffffffc28->size_alloced;
          local_90 = local_e8;
          local_88 = in_stack_fffffffffffffc28;
          alignedFree(in_stack_fffffffffffffbe8);
          in_stack_fffffffffffffc28->size_active = local_c8;
          in_stack_fffffffffffffc28->size_alloced = local_d0;
        }
        sVar3 = in_stack_fffffffffffffc30->size_active;
        in_stack_fffffffffffffc30->size_active = sVar3 + 1;
        local_1a0 = in_stack_fffffffffffffc30->items + sVar3;
        local_1a8 = &local_318;
        *(undefined8 *)&local_1a0->field_0 = local_318;
        *(undefined8 *)((long)&local_1a0->field_0 + 8) = uStack_310;
      }
      local_2a8 = in_RDI + 0x50;
      if ((ulong)local_340[2] < *(ulong *)(in_RDI + 0x58)) {
        local_210 = in_RDI + 0x50;
        local_218 = (ulong)local_340[2];
        puVar16 = (undefined8 *)(*(long *)(in_RDI + 0x68) + local_218 * 0x10);
        pvVar12 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(*in_RDX + 0x88),0);
        local_2b0 = std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  *)(*in_RDX + 0x70),0);
        local_228 = local_2b0->size_active - 1;
        local_2d0 = pvVar12->items + local_228;
        uVar4 = puVar16[1];
        *(undefined8 *)&local_2d0->field_0 = *puVar16;
        *(undefined8 *)((long)&local_2d0->field_0 + 8) = uVar4;
        local_2d8 = puVar16;
        local_220 = pvVar12;
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"WARNING: corrupted OBJ file");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
    }
    if (local_340[1] != 0xffffffff) {
      while( true ) {
        sVar13 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::size
                           ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                            (*in_RDX + 0xa0));
        local_2b8 = std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  *)(*in_RDX + 0x70),0);
        if (local_2b8->size_active <= sVar13) break;
        local_1f0 = &local_374;
        local_1d0 = &embree::zero;
        local_374 = 0;
        local_1d8 = &embree::zero;
        local_370 = 0;
        std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::push_back
                  ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                   CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (value_type *)in_stack_fffffffffffffbe8);
      }
      uVar1 = local_340[1];
      sVar13 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::size
                         ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                          (in_RDI + 0x70));
      if (uVar1 < sVar13) {
        pvVar14 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::
                  operator[]((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                             (in_RDI + 0x70),(ulong)local_340[1]);
        this_00 = (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                  (*in_RDX + 0xa0);
        local_2c0 = std::
                    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                    ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                  *)(*in_RDX + 0x70),0);
        local_1e0 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::
                    operator[](this_00,local_2c0->size_active - 1);
        (local_1e0->field_0).field_0.x = (pvVar14->field_0).field_0.x;
        (local_1e0->field_0).field_0.y = (pvVar14->field_0).field_0.y;
        local_1e8 = pvVar14;
      }
      else {
        poVar9 = std::operator<<((ostream *)&std::cout,"WARNING: corrupted OBJ file");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      }
    }
    local_2c8 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(*in_RDX + 0x70),0);
    uVar7 = (int)local_2c8->size_active - 1;
    pmVar15 = std::
              map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
              ::operator[]((map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
                            *)in_stack_fffffffffffffc30,(key_type *)in_stack_fffffffffffffc28);
    *pmVar15 = uVar7;
    local_31c = uVar7;
  }
  return local_31c;
}

Assistant:

uint32_t OBJLoader::getVertex(std::map<Vertex,uint32_t>& vertexMap, Ref<SceneGraph::TriangleMeshNode> mesh, const Vertex& i)
  {
    const std::map<Vertex, uint32_t>::iterator& entry = vertexMap.find(i);
    if (entry != vertexMap.end()) return(entry->second);
    
    if (i.v >= v.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
    else mesh->positions[0].push_back(v[i.v]);
      
    if (i.vn != -1) {
      while (mesh->normals[0].size() < mesh->positions[0].size()) mesh->normals[0].push_back(zero); // some vertices might not had a normal

      if (i.vn >= vn.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
      else mesh->normals[0][mesh->positions[0].size()-1] = vn[i.vn];
    }
    if (i.vt != -1) {
      while (mesh->texcoords.size() < mesh->positions[0].size()) mesh->texcoords.push_back(zero); // some vertices might not had a texture coordinate

      if (i.vt >= vt.size()) std::cout << "WARNING: corrupted OBJ file" << std::endl;
      else mesh->texcoords[mesh->positions[0].size()-1] = vt[i.vt];
    }
    return (vertexMap[i] = (unsigned int)(mesh->positions[0].size()) - 1);
  }